

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int dict_write(dict_t *dict,char *filename,char *format)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  char *local_60;
  int local_48;
  int local_44;
  int phlen;
  int j;
  char *phones;
  int i;
  FILE *fh;
  char *format_local;
  char *filename_local;
  dict_t *dict_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                   ,0xe1,"Failed to open \'%s\'",filename);
    dict_local._4_4_ = -1;
  }
  else {
    for (phones._4_4_ = 0; phones._4_4_ < dict->n_word; phones._4_4_ = phones._4_4_ + 1) {
      iVar1 = dict_real_word(dict,phones._4_4_);
      if (iVar1 != 0) {
        local_48 = 0;
        for (local_44 = 0; local_44 < dict->word[phones._4_4_].pronlen; local_44 = local_44 + 1) {
          pcVar2 = dict_ciphone_str(dict,phones._4_4_,local_44);
          sVar3 = strlen(pcVar2);
          local_48 = local_48 + (int)sVar3 + 1;
        }
        pcVar2 = (char *)__ckd_calloc__(1,(long)local_48,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                        ,0xeb);
        for (local_44 = 0; local_44 < dict->word[phones._4_4_].pronlen; local_44 = local_44 + 1) {
          __src = dict_ciphone_str(dict,phones._4_4_,local_44);
          strcat(pcVar2,__src);
          if (local_44 != dict->word[phones._4_4_].pronlen + -1) {
            strcat(pcVar2," ");
          }
        }
        if (phones._4_4_ < 0) {
          local_60 = (char *)0x0;
        }
        else {
          local_60 = dict->word[phones._4_4_].word;
        }
        fprintf(__stream,"%-30s %s\n",local_60,pcVar2);
        ckd_free(pcVar2);
      }
    }
    fclose(__stream);
    dict_local._4_4_ = 0;
  }
  return dict_local._4_4_;
}

Assistant:

int
dict_write(dict_t *dict, char const *filename, char const *format)
{
    FILE *fh;
    int i;

    (void)format; /* FIXME */
    if ((fh = fopen(filename, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open '%s'", filename);
        return -1;
    }
    for (i = 0; i < dict->n_word; ++i) {
        char *phones;
        int j, phlen;
        if (!dict_real_word(dict, i))
            continue;
        for (phlen = j = 0; j < dict_pronlen(dict, i); ++j)
            phlen += strlen(dict_ciphone_str(dict, i, j)) + 1;
        phones = ckd_calloc(1, phlen);
        for (j = 0; j < dict_pronlen(dict, i); ++j) {
            strcat(phones, dict_ciphone_str(dict, i, j));
            if (j != dict_pronlen(dict, i) - 1)
                strcat(phones, " ");
        }
        fprintf(fh, "%-30s %s\n", dict_wordstr(dict, i), phones);
        ckd_free(phones);
    }
    fclose(fh);
    return 0;
}